

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O3

void decompress(char *buffer_out)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  iVar5 = 0;
  iVar9 = 0;
  iVar7 = 0;
  bVar4 = true;
LAB_00104639:
  iVar8 = iVar9 + iVar5;
  iVar11 = iVar9 + iVar5 + 4;
  iVar5 = *(int *)(data + (long)iVar5 + (long)iVar9);
LAB_00104659:
  iVar9 = iVar11 + 1;
  bVar1 = data[iVar11];
  if (0xf < bVar1) {
    uVar12 = (uint)(bVar1 >> 4);
    if (uVar12 == 0xf) {
      pbVar6 = data + iVar9;
      uVar12 = 0xf;
      do {
        bVar2 = *pbVar6;
        uVar12 = uVar12 + bVar2;
        pbVar6 = pbVar6 + 1;
        iVar9 = iVar9 + 1;
      } while (bVar2 == 0xff);
    }
    *(undefined4 *)(buffer_out + iVar7) = *(undefined4 *)(data + iVar9);
    if (4 < (int)uVar12) {
      uVar13 = 4;
      do {
        *(undefined4 *)(buffer_out + uVar13 + (long)iVar7) =
             *(undefined4 *)(data + (long)iVar9 + uVar13);
        uVar13 = uVar13 + 4;
      } while (uVar13 < uVar12);
    }
    iVar7 = iVar7 + uVar12;
    iVar9 = iVar9 + uVar12;
    if (iVar5 + iVar8 + 4 <= iVar9) goto LAB_00104782;
  }
  iVar11 = iVar9 + 2;
  uVar12 = (bVar1 & 0xf) + 4;
  if (uVar12 == 0x13) {
    pbVar6 = data + iVar11;
    uVar12 = 0x13;
    do {
      bVar1 = *pbVar6;
      uVar12 = uVar12 + bVar1;
      pbVar6 = pbVar6 + 1;
      iVar11 = iVar11 + 1;
    } while (bVar1 == 0xff);
  }
  lVar10 = (long)(int)(iVar7 - (uint)*(ushort *)(data + iVar9));
  if (*(ushort *)(data + iVar9) < 4) {
    lVar14 = 0;
    do {
      buffer_out[lVar14 + iVar7] = buffer_out[lVar14 + lVar10];
      lVar14 = lVar14 + 1;
    } while (uVar12 != (uint)lVar14);
    iVar7 = iVar7 + (uint)lVar14;
  }
  else {
    *(undefined4 *)(buffer_out + iVar7) = *(undefined4 *)(buffer_out + lVar10);
    if (4 < (int)uVar12) {
      uVar13 = 4;
      do {
        *(undefined4 *)(buffer_out + uVar13 + (long)iVar7) =
             *(undefined4 *)(buffer_out + uVar13 + lVar10);
        uVar13 = uVar13 + 4;
      } while (uVar13 < uVar12);
    }
    iVar7 = iVar7 + uVar12;
  }
  goto LAB_00104659;
LAB_00104782:
  iVar9 = 4;
  bVar3 = !bVar4;
  bVar4 = false;
  if (bVar3) {
    return;
  }
  goto LAB_00104639;
}

Assistant:

void decompress(char* buffer_out) {
	int blockLength = 0;
    int p = 0;                                  //指向当前输出缓冲区的位置
	for(int i = 0; i < 2; i++) {
        int und_p = 4 * (i + 1) + blockLength;  //指向当前待解压区的位置
        blockLength = *((unsigned int*) (&data[4 * i + blockLength]));
		int und_end = und_p + blockLength;	    //待解压区的结束位置

		while (1) {
			int token = data[und_p++];

			//如果token中字面值长度是有的
			if (token >= 16) {
				int literalLength = token >> 4;    //字面值长度

				if (literalLength == 15) {
					//字面值长度大于等于15就接着去扩展区获取
					while (1) {
						int c = data[und_p++];
						literalLength += c;

						if (c != 255)
							break;
					}
				}

				//复制字面的字符
				copyToDestination(buffer_out, p, data, und_p, literalLength);

				//挪动当前位置指向和待压缩区位置指向
				p += literalLength;
				und_p += literalLength;

				//如果复制完字面字符已经到底了就退出
				if (und_p >= und_end)
					break;
			}

			//获取匹配字符串在的位置
			int ago_p = p - (*((unsigned short*)(&data[und_p])));
			und_p += 2;

			//获取token里的匹配长度
			int matchLength = (token & 15) + 4;

			if (matchLength == 15 + 4) {
				//如果有扩展长度就获取扩展的匹配长度
				while (1) {
					int c = data[und_p++];
					matchLength += c;

					if (c != 255)
						break;
				}
			}

			//偏移大于等于4可以大胆整块复制
			if (p - ago_p >= 4) {
				copyToDestination(buffer_out, p, (unsigned char*) buffer_out, ago_p, matchLength);
				p += matchLength;
			}
			else {
				//否则一个个字符复制
				while (matchLength-- != 0)
					buffer_out[p++] = buffer_out[ago_p++];
			}
		}
	}
}